

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

void free_Folder(_7z_folder *f)

{
  uint local_14;
  uint i;
  _7z_folder *f_local;
  
  if (f->coders != (_7z_coder *)0x0) {
    for (local_14 = 0; (ulong)local_14 < f->numCoders; local_14 = local_14 + 1) {
      free(f->coders[local_14].properties);
    }
    free(f->coders);
  }
  free(f->bindPairs);
  free(f->packedStreams);
  free(f->unPackSize);
  return;
}

Assistant:

static void
free_Folder(struct _7z_folder *f)
{
	unsigned i;

	if (f->coders) {
		for (i = 0; i< f->numCoders; i++) {
			free(f->coders[i].properties);
		}
		free(f->coders);
	}
	free(f->bindPairs);
	free(f->packedStreams);
	free(f->unPackSize);
}